

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O3

void __thiscall
JetHead::list<ComponentManager::ClassInfo_*>::clear(list<ComponentManager::ClassInfo_*> *this)

{
  iterator ret;
  iterator local_20;
  
  if (this->mHead->next != this->mTail) {
    do {
      iterator::erase(&local_20);
    } while (this->mHead->next != this->mTail);
  }
  return;
}

Assistant:

bool empty() const
		{
			return (mHead->next == mTail);
		}